

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screrror.cpp
# Opt level: O0

HRESULT MapHr(HRESULT hr,ErrorTypeEnum *errorTypeOut)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  int local_24;
  int local_20;
  int imhr;
  int imhrLim;
  int imhrMin;
  ErrorTypeEnum *errorTypeOut_local;
  HRESULT hr_local;
  
  if (MapHr::fCheckSort != 0) {
    MapHr::fCheckSort = 0;
    for (local_24 = 1; local_24 < 0x2e; local_24 = local_24 + 1) {
      if ((uint)g_rgmhr[local_24].hrIn <= (uint)g_rgmhr[local_24 + -1].hrIn) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/screrror.cpp"
                           ,0x8e,"((uint32)g_rgmhr[imhr - 1].hrIn < (uint32)g_rgmhr[imhr].hrIn)",
                           "(uint32)g_rgmhr[imhr - 1].hrIn < (uint32)g_rgmhr[imhr].hrIn");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
    }
  }
  if (errorTypeOut != (ErrorTypeEnum *)0x0) {
    *errorTypeOut = kjstError;
  }
  if (hr < 0) {
    errorTypeOut_local._4_4_ = hr;
    if ((hr >> 0x10 & 0x1fffU) != 10) {
      imhr = 0;
      local_20 = 0x2e;
      iVar3 = local_20;
      while (local_20 = iVar3, imhr < local_20) {
        iVar3 = (imhr + local_20) / 2;
        if ((uint)g_rgmhr[iVar3].hrIn < (uint)hr) {
          imhr = iVar3 + 1;
          iVar3 = local_20;
        }
      }
      if ((imhr < 0x2e) && (hr == g_rgmhr[imhr].hrIn)) {
        if (errorTypeOut != (ErrorTypeEnum *)0x0) {
          *errorTypeOut = g_rgmhr[imhr].errorType;
        }
        errorTypeOut_local._4_4_ = g_rgmhr[imhr].hrOut;
      }
    }
  }
  else {
    errorTypeOut_local._4_4_ = 0;
  }
  return errorTypeOut_local._4_4_;
}

Assistant:

HRESULT MapHr(HRESULT hr, ErrorTypeEnum * errorTypeOut)
{
    int imhrMin, imhrLim, imhr;

#if DEBUG
    // In debug, check that all the entries in the error map table are
    // sorted based on the HRESULT in ascending order. We will then binary
    // search the sorted array. We need do this only once per invocation.
    static BOOL fCheckSort = TRUE;

    if (fCheckSort)
    {
        fCheckSort = FALSE;
        for (imhr = 1; imhr < kcmhr; imhr++)
            Assert((uint32)g_rgmhr[imhr - 1].hrIn < (uint32)g_rgmhr[imhr].hrIn);
    }
#endif // DEBUG

    if (errorTypeOut != nullptr)
    {
        *errorTypeOut = kjstError;
    }

    if (SUCCEEDED(hr))
        return NOERROR;

    if (FACILITY_CONTROL == HRESULT_FACILITY(hr))
        return hr;

    for (imhrMin = 0, imhrLim = kcmhr; imhrMin < imhrLim; )
    {
        imhr = (imhrMin + imhrLim) / 2;
        if ((uint32)g_rgmhr[imhr].hrIn < (uint32)hr)
            imhrMin = imhr + 1;
        else
            imhrLim = imhr;
    }
    if (imhrMin < kcmhr && hr == g_rgmhr[imhrMin].hrIn)
    {
        if (errorTypeOut != nullptr)
        {
            *errorTypeOut = g_rgmhr[imhrMin].errorType;
        }

        return g_rgmhr[imhrMin].hrOut;
    }

    return hr;
}